

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

void ZSTD_copyBlockSequences(ZSTD_CCtx *zc)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ZSTD_longLengthType_e ZVar4;
  seqDef *psVar5;
  seqDef *psVar6;
  ZSTD_Sequence *pZVar7;
  BYTE *pBVar8;
  ZSTD_compressedBlockState_t *pZVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint *puVar15;
  uint uVar16;
  U32 *pUVar17;
  undefined8 local_50;
  U32 local_48 [2];
  BYTE *local_40;
  size_t local_38;
  
  psVar5 = (zc->seqStore).sequencesStart;
  psVar6 = (zc->seqStore).sequences;
  lVar10 = (long)psVar6 - (long)psVar5 >> 3;
  pZVar7 = (zc->seqCollector).seqStart;
  local_38 = (zc->seqCollector).seqIndex;
  pBVar8 = (zc->seqStore).lit;
  local_40 = (zc->seqStore).litStart;
  pZVar9 = (zc->blockState).prevCBlock;
  local_48[0] = pZVar9->rep[2];
  local_50 = *(ulong *)pZVar9->rep;
  if (psVar6 == psVar5) {
    uVar13 = 0;
    iVar14 = 0;
  }
  else {
    uVar3 = (zc->seqStore).longLengthPos;
    puVar15 = &pZVar7[local_38].rep;
    iVar14 = 0;
    uVar13 = 0;
    do {
      uVar16 = psVar5[uVar13].offset;
      uVar1 = psVar5[uVar13].litLength;
      puVar15[-2] = (uint)uVar1;
      uVar2 = psVar5[uVar13].matchLength;
      puVar15[-1] = uVar2 + 3;
      *puVar15 = 0;
      if (uVar3 == uVar13) {
        ZVar4 = (zc->seqStore).longLengthType;
        if (ZVar4 == ZSTD_llt_matchLength) {
          puVar15[-1] = uVar2 + 0x10003;
        }
        else if (ZVar4 == ZSTD_llt_literalLength) {
          puVar15[-2] = uVar1 + 0x10000;
        }
      }
      if (uVar16 < 4) {
        *puVar15 = uVar16;
        if (puVar15[-2] == 0) {
          if (uVar16 == 3) {
            uVar11 = (int)local_50 - 1;
          }
          else {
            uVar11 = local_48[(ulong)uVar16 - 2];
          }
        }
        else {
          uVar11 = local_48[(ulong)(uVar16 - 1) - 2];
        }
      }
      else {
        uVar11 = uVar16 - 3;
      }
      ((ZSTD_Sequence *)(puVar15 + -3))->offset = uVar11;
      if (uVar16 - 1 < 3) {
        uVar16 = (uVar16 - 1) + (uint)(uVar1 == 0);
        if (uVar16 == 0) {
          uVar12 = local_50 >> 0x20;
          pUVar17 = local_48;
        }
        else {
          if (uVar16 == 3) {
            uVar11 = (int)local_50 - 1;
          }
          else {
            uVar11 = local_48[(ulong)uVar16 - 2];
          }
          pUVar17 = local_48 + ((ulong)(uVar16 == 1) - 1);
          uVar12 = local_50 & 0xffffffff;
          local_50 = (ulong)uVar11;
        }
      }
      else {
        uVar12 = local_50 & 0xffffffff;
        local_50 = (ulong)(uVar16 - 3);
        pUVar17 = (U32 *)((long)&local_50 + 4);
      }
      local_50 = local_50 & 0xffffffff | uVar12 << 0x20;
      local_48[0] = *pUVar17;
      iVar14 = iVar14 + puVar15[-2];
      uVar13 = uVar13 + 1;
      puVar15 = puVar15 + 4;
    } while (lVar10 + (ulong)(lVar10 == 0) != uVar13);
  }
  pZVar7[local_38 + uVar13].litLength = (int)pBVar8 - (iVar14 + (int)local_40);
  pZVar7[local_38 + uVar13].offset = 0;
  pZVar7[local_38 + uVar13].matchLength = 0;
  pZVar7[local_38 + uVar13].rep = 0;
  (zc->seqCollector).seqIndex = lVar10 + 1 + local_38;
  return;
}

Assistant:

static void ZSTD_copyBlockSequences(ZSTD_CCtx* zc)
{
    const seqStore_t* seqStore = ZSTD_getSeqStore(zc);
    const seqDef* seqStoreSeqs = seqStore->sequencesStart;
    size_t seqStoreSeqSize = seqStore->sequences - seqStoreSeqs;
    size_t seqStoreLiteralsSize = (size_t)(seqStore->lit - seqStore->litStart);
    size_t literalsRead = 0;
    size_t lastLLSize;

    ZSTD_Sequence* outSeqs = &zc->seqCollector.seqStart[zc->seqCollector.seqIndex];
    size_t i;
    repcodes_t updatedRepcodes;

    assert(zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences);
    /* Ensure we have enough space for last literals "sequence" */
    assert(zc->seqCollector.maxSequences >= seqStoreSeqSize + 1);
    ZSTD_memcpy(updatedRepcodes.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (i = 0; i < seqStoreSeqSize; ++i) {
        U32 rawOffset = seqStoreSeqs[i].offset - ZSTD_REP_NUM;
        outSeqs[i].litLength = seqStoreSeqs[i].litLength;
        outSeqs[i].matchLength = seqStoreSeqs[i].matchLength + MINMATCH;
        outSeqs[i].rep = 0;

        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        if (seqStoreSeqs[i].offset <= ZSTD_REP_NUM) {
            /* Derive the correct offset corresponding to a repcode */
            outSeqs[i].rep = seqStoreSeqs[i].offset;
            if (outSeqs[i].litLength != 0) {
                rawOffset = updatedRepcodes.rep[outSeqs[i].rep - 1];
            } else {
                if (outSeqs[i].rep == 3) {
                    rawOffset = updatedRepcodes.rep[0] - 1;
                } else {
                    rawOffset = updatedRepcodes.rep[outSeqs[i].rep];
                }
            }
        }
        outSeqs[i].offset = rawOffset;
        /* seqStoreSeqs[i].offset == offCode+1, and ZSTD_updateRep() expects offCode
           so we provide seqStoreSeqs[i].offset - 1 */
        updatedRepcodes = ZSTD_updateRep(updatedRepcodes.rep,
                                         seqStoreSeqs[i].offset - 1,
                                         seqStoreSeqs[i].litLength == 0);
        literalsRead += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(seqStoreLiteralsSize >= literalsRead);
    lastLLSize = seqStoreLiteralsSize - literalsRead;
    outSeqs[i].litLength = (U32)lastLLSize;
    outSeqs[i].matchLength = outSeqs[i].offset = outSeqs[i].rep = 0;
    seqStoreSeqSize++;
    zc->seqCollector.seqIndex += seqStoreSeqSize;
}